

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

Gia_Man_t * Abc_NtkHieCecTest2(char *pFileName,char *pModelName,int fVerbose)

{
  abctime aVar1;
  Au_Ntk_t *pNtk_00;
  abctime aVar2;
  abctime aVar3;
  abctime clk;
  abctime clk1;
  Au_Ntk_t *pNtkClp;
  Au_Ntk_t *pNtk;
  Gia_Man_t *pGia;
  int fSimulation;
  int fVerbose_local;
  char *pModelName_local;
  char *pFileName_local;
  
  clk1 = 0;
  aVar1 = Abc_Clock();
  pNtk_00 = Au_NtkParseCBlif(pFileName);
  if (pNtk_00 == (Au_Ntk_t *)0x0) {
    printf("Reading CBLIF file has failed.\n");
    pFileName_local = (char *)0x0;
  }
  else if ((pNtk_00->pMan == (Au_Man_t *)0x0) || ((pNtk_00->pMan->vNtks).pArray == (void **)0x0)) {
    printf("There is no hierarchy information.\n");
    Au_NtkFree(pNtk_00);
    pFileName_local = (char *)0x0;
  }
  else {
    aVar2 = Abc_Clock();
    Abc_PrintTime(1,"Reading file",aVar2 - aVar1);
    if (fVerbose != 0) {
      Au_ManPrintBoxInfo(pNtk_00);
      Au_ManPrintStats(pNtk_00->pMan);
    }
    Au_ManCountThings(pNtk_00->pMan);
    if (pModelName != (char *)0x0) {
      clk1 = (abctime)Au_ManFindNtkP(pNtk_00->pMan,pModelName);
    }
    if (clk1 == 0) {
      clk1 = (abctime)pNtk_00;
    }
    Au_NtkCheckRecursive((Au_Ntk_t *)clk1);
    aVar2 = Abc_Clock();
    pFileName_local = (char *)Au_NtkDeriveFlatGia((Au_Ntk_t *)clk1);
    aVar3 = Abc_Clock();
    Abc_PrintTime(1,"Time GIA ",aVar3 - aVar2);
    Au_ManDelete(pNtk_00->pMan);
    aVar2 = Abc_Clock();
    Abc_PrintTime(1,"Time all ",aVar2 - aVar1);
  }
  return (Gia_Man_t *)pFileName_local;
}

Assistant:

Gia_Man_t * Abc_NtkHieCecTest2( char * pFileName, char * pModelName, int fVerbose )
{
    int fSimulation = 0;
    Gia_Man_t * pGia = NULL;
    Au_Ntk_t * pNtk, * pNtkClp = NULL;
    abctime clk1 = 0, clk = Abc_Clock();

    // read hierarchical netlist
    pNtk = Au_NtkParseCBlif( pFileName );
    if ( pNtk == NULL )
    {
        printf( "Reading CBLIF file has failed.\n" );
        return NULL;
    }
    if ( pNtk->pMan == NULL || pNtk->pMan->vNtks.pArray == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        Au_NtkFree( pNtk );
        return NULL;
    }
    Abc_PrintTime( 1, "Reading file", Abc_Clock() - clk );

    if ( fVerbose )
    {
        Au_ManPrintBoxInfo( pNtk );
//    Au_ManPrintBoxInfoSorted( pNtk );
        Au_ManPrintStats( pNtk->pMan );
    }
    Au_ManCountThings( pNtk->pMan );

    // select network
    if ( pModelName )
        pNtkClp = Au_ManFindNtkP( pNtk->pMan, pModelName );
    if ( pNtkClp == NULL )
        pNtkClp = pNtk;

    // check if the model is recursive
    Au_NtkCheckRecursive( pNtkClp );

    // collapse
    clk1 = Abc_Clock();
    if ( fSimulation )
    {
        Au_NtkTerSimulate( pNtkClp );
        Abc_PrintTime( 1, "Time sim ", Abc_Clock() - clk1 );
    }
    else
    {
        pGia = Au_NtkDeriveFlatGia( pNtkClp );
        Abc_PrintTime( 1, "Time GIA ", Abc_Clock() - clk1 );
    }

    // delete
    Au_ManDelete( pNtk->pMan );
    Abc_PrintTime( 1, "Time all ", Abc_Clock() - clk );
    return pGia;
}